

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::updatePlaceholderVisibility(QPlainTextEditPrivate *this)

{
  byte bVar1;
  bool bVar2;
  QPlainTextEditPrivate *in_RDI;
  QPlainTextEditPrivate *this_00;
  
  bVar1 = in_RDI->field_0x348;
  this_00 = in_RDI;
  bVar2 = placeHolderTextToBeShown(in_RDI);
  if ((bool)(bVar1 >> 7) != bVar2) {
    QWidget::update((QWidget *)in_RDI);
    bVar2 = placeHolderTextToBeShown(this_00);
    in_RDI->field_0x348 = in_RDI->field_0x348 & 0x7f | bVar2 << 7;
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::updatePlaceholderVisibility()
{
    // We normally only repaint the part of view that contains text in the
    // document that has changed (in repaintContents). But the placeholder
    // text is not a part of the document, but is drawn on separately. So whenever
    // we either show or hide the placeholder text, we issue a full update.
    if (placeholderTextShown != placeHolderTextToBeShown()) {
        viewport->update();
        placeholderTextShown = placeHolderTextToBeShown();
    }
}